

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  char cVar1;
  pointer puVar2;
  pointer pcVar3;
  Option *this_00;
  size_t __n;
  pointer pcVar4;
  pointer psVar5;
  App *pAVar6;
  size_type *psVar7;
  App *pAVar8;
  undefined8 *puVar9;
  size_type sVar10;
  pointer ppAVar11;
  string *psVar12;
  int iVar13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  ostream *poVar15;
  pointer pbVar16;
  pointer psVar17;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  _Var18;
  size_t sVar19;
  App *pAVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  undefined7 in_register_00000009;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  App **ppAVar23;
  pointer pbVar24;
  pointer ppAVar25;
  byte bVar26;
  undefined8 uVar27;
  _Alloc_hider _Var28;
  undefined7 in_register_00000081;
  size_type __len2;
  byte bVar29;
  Option_p *opt;
  pointer puVar30;
  _Alloc_hider _Var31;
  string single_name;
  string name;
  string value;
  string commentLead;
  string commentTest;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  string keyChars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  value_type local_438;
  string local_418;
  string local_3f8;
  uint local_3d8;
  uint local_3d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  App **local_370;
  App *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  string *local_358;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  ConfigBase *local_2d0;
  size_type *local_2c8;
  size_type local_2c0;
  size_type local_2b8;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  string local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  string local_268 [2];
  string *local_220;
  _Any_data local_218;
  code *local_208;
  undefined8 uStack_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_370 = (App **)CONCAT44(local_370._4_4_,(int)CONCAT71(in_register_00000081,write_description)
                              );
  local_3d4 = (uint)CONCAT71(in_register_00000009,default_also);
  local_358 = prefix;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0._M_string_length = 0;
  local_3d0.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_3d0,this->commentChar);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_3d0,' ');
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"#;","");
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_390,this->commentChar);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_390,this->parentSeparatorChar);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_308,local_390._M_dataplus._M_p,
             local_390._M_dataplus._M_p + local_390._M_string_length);
  local_220 = __return_storage_ptr__;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_308,this->literalQuote);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_308,this->stringQuote);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_308,this->arrayStart);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_308,this->arrayEnd);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_308,this->valueDelimiter);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_308,this->arraySeparator);
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar30 = (app->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (app->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar30 != puVar2) {
    do {
      _Var14 = ::std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (local_2e8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          local_2e8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (puVar30->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      if (_Var14._M_current ==
          local_2e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_2e8,
                    (value_type *)
                    (puVar30->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      }
      puVar30 = puVar30 + 1;
    } while (puVar30 != puVar2);
  }
  pbVar24 = local_2e8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Options","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_2e8,(const_iterator)pbVar24,&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if (((byte)local_370 != '\0') &&
     (((app->configurable_ != false || (app->parent_ == (App *)0x0)) ||
      ((app->name_)._M_string_length == 0)))) {
    poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,local_3d0._M_dataplus._M_p,local_3d0._M_string_length);
    pcVar3 = (app->description_)._M_dataplus._M_p;
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,pcVar3,pcVar3 + (app->description_)._M_string_length);
    detail::fix_newlines(&local_438,(string *)&local_3d0,&local_1d8);
    poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_438._M_dataplus._M_p,local_438._M_string_length);
    local_3f8._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&local_3f8,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  local_360 = local_2e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_368 = app;
  if (local_2e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar29 = 0;
    pbVar24 = local_2e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_2d0 = this;
    do {
      iVar13 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(pbVar24,"Options");
      if (((iVar13 != 0) && (bVar26 = bVar29, pbVar24->_M_string_length != 0)) ||
         (bVar26 = 1, (bVar29 & 1) == 0)) {
        if ((((byte)local_370 != '\0') &&
            (iVar13 = ::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (pbVar24,"Options"), iVar13 != 0)) &&
           (pbVar24->_M_string_length != 0)) {
          local_438._M_dataplus._M_p._0_1_ = 10;
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_438,1);
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,local_3d0._M_dataplus._M_p,local_3d0._M_string_length);
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,(pbVar24->_M_dataplus)._M_p,pbVar24->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," Options\n",9);
        }
        local_218._M_unused._M_object = (void *)0x0;
        local_218._8_8_ = 0;
        local_208 = (code *)0x0;
        uStack_200 = 0;
        CLI::App::get_options
                  ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)&local_330,
                   app,(function<bool_(const_CLI::Option_*)> *)&local_218);
        local_3d8 = CONCAT31(local_3d8._1_3_,bVar26);
        _Var31._M_p = local_330._M_dataplus._M_p;
        puVar9 = (undefined8 *)local_330._M_string_length;
        if (local_208 != (code *)0x0) {
          (*local_208)((_Any_data *)&local_218,(_Any_data *)&local_218,__destroy_functor);
          _Var31._M_p = local_330._M_dataplus._M_p;
          puVar9 = (undefined8 *)local_330._M_string_length;
        }
        for (; _Var31._M_p != (pointer)puVar9; _Var31._M_p = (pointer)((long)_Var31._M_p + 8)) {
          this_00 = *(Option **)_Var31._M_p;
          if (((this_00->super_OptionBase<CLI::Option>).configurable_ == true) &&
             (((__n = (this_00->super_OptionBase<CLI::Option>).group_._M_string_length,
               __n == pbVar24->_M_string_length &&
               ((__n == 0 ||
                (iVar13 = bcmp((this_00->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p,
                               (pbVar24->_M_dataplus)._M_p,__n), iVar13 == 0)))) ||
              ((iVar13 = ::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (pbVar24,"Options"), iVar13 == 0 &&
               ((this_00->super_OptionBase<CLI::Option>).group_._M_string_length == 0)))))) {
            pbVar16 = (this_00->lnames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((pbVar16 ==
                 (this_00->lnames_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               (pbVar16 = (this_00->snames_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
               pbVar16 ==
               (this_00->snames_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
              pbVar16 = (pointer)&(&this_00->pname_)[(this_00->pname_)._M_string_length == 0].
                                  _M_dataplus;
            }
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            pcVar4 = (pbVar16->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_438,pcVar4,pcVar4 + pbVar16->_M_string_length);
            if (local_438._M_string_length != 0) {
              Option::reduced_results_abi_cxx11_((results_t *)&local_418,this_00);
              detail::ini_join(&local_3f8,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_418,this->arraySeparator,this->arrayStart,this->arrayEnd,
                               this->stringQuote,this->literalQuote);
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_418);
              if ((char)local_3d4 == '\x01' && local_3f8._M_string_length == 0) {
                pcVar3 = (this_00->default_str_)._M_dataplus._M_p;
                local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_418,pcVar3,
                           pcVar3 + (this_00->default_str_)._M_string_length);
                sVar10 = local_418._M_string_length;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != &local_418.field_2) {
                  operator_delete(local_418._M_dataplus._M_p,
                                  local_418.field_2._M_allocated_capacity + 1);
                }
                this = local_2d0;
                if (sVar10 == 0) {
                  if (this_00->expected_min_ == 0) {
                    __len2 = 5;
                    __s = "false";
                  }
                  else {
                    __len2 = 2;
                    __s = "\"\"";
                    if (this_00->run_callback_for_default_ != true) goto LAB_00239f26;
                  }
                  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::_M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_3f8,0,local_3f8._M_string_length,__s,__len2);
                }
                else {
                  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
                  pcVar3 = (this_00->default_str_)._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_3b0,pcVar3,
                             pcVar3 + (this_00->default_str_)._M_string_length);
                  detail::convert_arg_for_ini
                            (&local_418,&local_3b0,this->stringQuote,this->literalQuote,false);
                  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_3f8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_418);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,
                                    local_418.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                    operator_delete(local_3b0._M_dataplus._M_p,
                                    local_3b0.field_2._M_allocated_capacity + 1);
                  }
                }
              }
LAB_00239f26:
              if (local_3f8._M_string_length != 0) {
                if ((this_00->fnames_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    (this_00->fnames_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_2a8,local_3f8._M_dataplus._M_p,
                             local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
                  Option::get_flag_value(&local_418,this_00,&local_438,&local_2a8);
                  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_3f8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_418);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,
                                    local_418.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                    operator_delete(local_2a8._M_dataplus._M_p,
                                    local_2a8.field_2._M_allocated_capacity + 1);
                  }
                }
                if (((byte)local_370 != '\0') && ((this_00->description_)._M_string_length != 0)) {
                  local_418._M_dataplus._M_p._0_1_ = 10;
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,(char *)&local_418,1);
                  poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,local_3d0._M_dataplus._M_p,
                                       local_3d0._M_string_length);
                  local_268[0]._M_dataplus._M_p = (pointer)&local_268[0].field_2;
                  pcVar3 = (this_00->description_)._M_dataplus._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_268,pcVar3,
                             pcVar3 + (this_00->description_)._M_string_length);
                  detail::fix_newlines(&local_418,(string *)&local_3d0,local_268);
                  poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar15,local_418._M_dataplus._M_p,local_418._M_string_length
                                      );
                  local_3b0._M_dataplus._M_p._0_1_ = 10;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&local_3b0,1)
                  ;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,
                                    local_418.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_268[0]._M_dataplus._M_p != &local_268[0].field_2) {
                    operator_delete(local_268[0]._M_dataplus._M_p,
                                    local_268[0].field_2._M_allocated_capacity + 1);
                  }
                }
                CLI::clean_name_string(&local_438,(string *)&local_308);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_418,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_358,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_438);
                poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    (local_1a8,local_418._M_dataplus._M_p,local_418._M_string_length
                                    );
                local_3b0._M_dataplus._M_p._0_1_ = this->valueDelimiter;
                poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,(char *)&local_3b0,1);
                poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,local_3f8._M_dataplus._M_p,local_3f8._M_string_length);
                local_3b0._M_dataplus._M_p._0_1_ = 10;
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&local_3b0,1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != &local_418.field_2) {
                  operator_delete(local_418._M_dataplus._M_p,
                                  local_418.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_330._M_dataplus._M_p,
                          local_330.field_2._M_allocated_capacity - (long)local_330._M_dataplus._M_p
                         );
        }
        app = local_368;
        bVar29 = (byte)local_3d8;
      }
      pbVar24 = pbVar24 + 1;
    } while (pbVar24 != local_360);
  }
  local_438.field_2._M_allocated_capacity = 0;
  local_438.field_2._8_8_ = 0;
  local_438._M_dataplus._M_p = (pointer)0x0;
  local_438._M_string_length = 0;
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
            (&local_348,
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_3f8);
  psVar5 = (app->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppAVar23 = local_348.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (psVar17 = (app->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar17 != psVar5; psVar17 = psVar17 + 1
      ) {
    *ppAVar23 = (psVar17->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppAVar23 = ppAVar23 + 1;
  }
  if (((code *)local_438.field_2._M_allocated_capacity != (code *)0x0) &&
     (_Var18 = ::std::
               __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                         ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                           )local_348.
                            super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                          (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                           )local_348.
                            super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish,
                          (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_ThirdParty_helics_external_CLI11_CLI11_hpp:8510:39)>
                           )&local_438),
     _Var18._M_current !=
     local_348.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    local_348.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)_Var18;
  }
  if ((code *)local_438.field_2._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_438.field_2._M_allocated_capacity)(&local_438,&local_438,3);
  }
  ppAVar11 = local_348.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_3d8 = local_3d4 & 0xff;
  local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(local_360._4_4_,(uint)(byte)local_370);
  if (local_348.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_348.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar25 = local_348.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar6 = *ppAVar25;
      if (((pAVar6->name_)._M_string_length == 0) &&
         (((char)local_3d4 != '\0' || (sVar19 = CLI::App::count_all(pAVar6), sVar19 != 0)))) {
        if (((byte)local_370 != '\0') && ((pAVar6->group_)._M_string_length != 0)) {
          local_438._M_dataplus._M_p._0_1_ = 10;
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_438,1);
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,local_3d0._M_dataplus._M_p,local_3d0._M_string_length);
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,(pAVar6->group_)._M_dataplus._M_p,
                               (pAVar6->group_)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," Options\n",9);
        }
        pcVar3 = (local_358->_M_dataplus)._M_p;
        local_1f8[0] = local_1e8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,pcVar3,pcVar3 + local_358->_M_string_length);
        (**(this->super_Config)._vptr_Config)
                  (&local_438,this,pAVar6,(ulong)local_3d8,(ulong)local_360 & 0xffffffff,
                   (string *)local_1f8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_438._M_dataplus._M_p,local_438._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,
                          (ulong)(local_438.field_2._M_allocated_capacity + 1));
        }
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0],local_1e8[0] + 1);
        }
      }
      ppAVar25 = ppAVar25 + 1;
    } while (ppAVar25 != ppAVar11);
  }
  ppAVar11 = local_348.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (local_348.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_348.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar25 = local_348.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar6 = *ppAVar25;
      if (((pAVar6->name_)._M_string_length != 0) &&
         (((char)local_3d4 != '\0' || (sVar19 = CLI::App::count_all(pAVar6), sVar19 != 0)))) {
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        pcVar3 = (pAVar6->name_)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_438,pcVar3,pcVar3 + (pAVar6->name_)._M_string_length);
        CLI::clean_name_string(&local_438,(string *)&local_308);
        if ((pAVar6->configurable_ == true) &&
           (((char)local_3d4 != '\0' ||
            (pAVar20 = CLI::App::get_subcommand(local_368,pAVar6), pAVar20->parsed_ != 0)))) {
          if ((local_358->_M_string_length == 0) && (local_368->parent_ != (App *)0x0)) {
            local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
            pcVar3 = (local_368->name_)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3f8,pcVar3,pcVar3 + (local_368->name_)._M_string_length);
            CLI::clean_name_string(&local_3f8,(string *)&local_308);
            cVar1 = this->parentSeparatorChar;
            local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3b0,local_3f8._M_dataplus._M_p,
                       local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_3b0,local_3b0._M_string_length,0,1,cVar1);
            pbVar21 = ::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_3b0,local_438._M_dataplus._M_p,local_438._M_string_length
                                );
            local_418._M_dataplus._M_p = (pbVar21->_M_dataplus)._M_p;
            paVar22 = &pbVar21->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p == paVar22) {
              local_418.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
              local_418.field_2._8_8_ = *(undefined8 *)((long)&pbVar21->field_2 + 8);
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            }
            else {
              local_418.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
            }
            local_418._M_string_length = pbVar21->_M_string_length;
            (pbVar21->_M_dataplus)._M_p = (pointer)paVar22;
            pbVar21->_M_string_length = 0;
            (pbVar21->field_2)._M_local_buf[0] = '\0';
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_438,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_418);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
              operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1
                             );
            }
            pAVar20 = local_368->parent_;
            pAVar8 = pAVar20->parent_;
            while (pAVar8 != (App *)0x0) {
              local_370 = &pAVar20->parent_;
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
              pcVar3 = (pAVar20->name_)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_418,pcVar3,pcVar3 + (pAVar20->name_)._M_string_length);
              CLI::clean_name_string(&local_418,(string *)&local_308);
              cVar1 = this->parentSeparatorChar;
              local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_330,local_418._M_dataplus._M_p,
                         local_418._M_dataplus._M_p + local_418._M_string_length);
              ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace_aux(&local_330,local_330._M_string_length,0,1,cVar1);
              pbVar21 = ::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (&local_330,local_438._M_dataplus._M_p,local_438._M_string_length)
              ;
              local_3b0._M_dataplus._M_p = (pbVar21->_M_dataplus)._M_p;
              paVar22 = &pbVar21->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p == paVar22) {
                local_3b0.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
                local_3b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar21->field_2 + 8);
                local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
              }
              else {
                local_3b0.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
              }
              local_3b0._M_string_length = pbVar21->_M_string_length;
              (pbVar21->_M_dataplus)._M_p = (pointer)paVar22;
              pbVar21->_M_string_length = 0;
              (pbVar21->field_2)._M_local_buf[0] = '\0';
              ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_438,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_3b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
              pAVar20 = *local_370;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != &local_418.field_2) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              pAVar8 = pAVar20->parent_;
            }
            local_418._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_418._M_dataplus._M_p >> 8);
            local_418._M_dataplus._M_p._0_1_ = 0x5b;
            poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)&local_418,1);
            poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_438._M_dataplus._M_p,local_438._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"]\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            local_3f8._M_dataplus._M_p._0_1_ = 0x5b;
            poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)&local_3f8,1);
            poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,(local_358->_M_dataplus)._M_p,local_358->_M_string_length);
            poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_438._M_dataplus._M_p,local_438._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"]\n",2);
          }
          local_288[0] = &local_278;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
          (**(this->super_Config)._vptr_Config)
                    (&local_3f8,this,pAVar6,(ulong)local_3d8,(ulong)local_360 & 0xffffffff,
                     (string *)local_288);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_3f8._M_dataplus._M_p,local_3f8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          uVar27 = local_278._M_allocated_capacity;
          _Var28._M_p = (pointer)local_288[0];
          if (local_288[0] != &local_278) {
LAB_0023a9d5:
            operator_delete(_Var28._M_p,uVar27 + 1);
          }
        }
        else {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_418,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_358,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_438);
          pbVar21 = ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                    _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_418,local_418._M_string_length,0,1,
                                   this->parentSeparatorChar);
          local_2c8 = &local_2b8;
          psVar7 = (size_type *)(pbVar21->_M_dataplus)._M_p;
          paVar22 = &pbVar21->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7 == paVar22) {
            local_2b8 = paVar22->_M_allocated_capacity;
            uStack_2b0 = *(undefined4 *)((long)&pbVar21->field_2 + 8);
            uStack_2ac = *(undefined4 *)((long)&pbVar21->field_2 + 0xc);
          }
          else {
            local_2b8 = paVar22->_M_allocated_capacity;
            local_2c8 = psVar7;
          }
          local_2c0 = pbVar21->_M_string_length;
          (pbVar21->_M_dataplus)._M_p = (pointer)paVar22;
          pbVar21->_M_string_length = 0;
          (pbVar21->field_2)._M_local_buf[0] = '\0';
          (**(this->super_Config)._vptr_Config)
                    (&local_3f8,this,pAVar6,(ulong)local_3d8,(ulong)local_360 & 0xffffffff,
                     &local_2c8);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_3f8._M_dataplus._M_p,local_3f8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          if (local_2c8 != &local_2b8) {
            operator_delete(local_2c8,local_2b8 + 1);
          }
          uVar27 = local_418.field_2._M_allocated_capacity;
          _Var28._M_p = local_418._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) goto LAB_0023a9d5;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,
                          (ulong)(local_438.field_2._M_allocated_capacity + 1));
        }
      }
      ppAVar25 = ppAVar25 + 1;
    } while (ppAVar25 != ppAVar11);
  }
  psVar12 = local_220;
  ::std::__cxx11::stringbuf::str();
  if (local_348.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (App **)0x0) {
    operator_delete(local_348.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,
                    CONCAT71(local_3d0.field_2._M_allocated_capacity._1_7_,
                             local_3d0.field_2._M_local_buf[0]) + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar12;
}

Assistant:

CLI11_INLINE std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::string commentTest = "#;";
    commentTest.push_back(commentChar);
    commentTest.push_back(parentSeparatorChar);

    std::string keyChars = commentTest;
    keyChars.push_back(literalQuote);
    keyChars.push_back(stringQuote);
    keyChars.push_back(arrayStart);
    keyChars.push_back(arrayEnd);
    keyChars.push_back(valueDelimiter);
    keyChars.push_back(arraySeparator);

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("Options"));
    if(write_description && (app->get_configurable() || app->get_parent() == nullptr || app->get_name().empty())) {
        out << commentLead << detail::fix_newlines(commentLead, app->get_description()) << '\n';
    }
    for(auto &group : groups) {
        if(group == "Options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "Options" && !group.empty()) {
            out << '\n' << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {

            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "Options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string single_name = opt->get_single_name();
                if(single_name.empty()) {
                    continue;
                }

                std::string value = detail::ini_join(
                    opt->reduced_results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                
                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str(), stringQuote, literalQuote, false);
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    } else if(opt->get_run_callback_for_default()) {
                        value = "\"\"";  // empty string default value
                    }
                }

                if(!value.empty()) {

                    if(!opt->get_fnames().empty()) {
                        try {
                            value = opt->get_flag_value(single_name, value);
                        } catch(const CLI::ArgumentMismatch &) {
                            bool valid{false};
                            for(const auto &test_name : opt->get_fnames()) {
                                try {
                                    value = opt->get_flag_value(test_name, value);
                                    single_name = test_name;
                                    valid = true;
                                } catch(const CLI::ArgumentMismatch &) {
                                    continue;
                                }
                            }
                            if(!valid) {
                                value = detail::ini_join(
                                    opt->results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                            }
                        }
                    }
                    if(write_description && opt->has_description()) {
                        out << '\n';
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    clean_name_string(single_name, keyChars);

                    std::string name = prefix + single_name;

                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }
    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            /*if (!prefix.empty() || app->get_parent() == nullptr) {
                out << '[' << prefix << "___"<< subcom->get_group() << "]\n";
            } else {
                std::string subname = app->get_name() + parentSeparatorChar + "___"+subcom->get_group();
                const auto *p = app->get_parent();
                while(p->get_parent() != nullptr) {
                    subname = p->get_name() + parentSeparatorChar +subname;
                    p = p->get_parent();
                }
                out << '[' << subname << "]\n";
            }
            */
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            std::string subname = subcom->get_name();
            clean_name_string(subname, keyChars);

            if(subcom->get_configurable() && (default_also || app->got_subcommand(subcom))) {
                if(!prefix.empty() || app->get_parent() == nullptr) {

                    out << '[' << prefix << subname << "]\n";
                } else {
                    std::string appname = app->get_name();
                    clean_name_string(appname, keyChars);
                    subname = appname + parentSeparatorChar + subname;
                    const auto *p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        std::string pname = p->get_name();
                        clean_name_string(pname, keyChars);
                        subname = pname + parentSeparatorChar + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subname + parentSeparatorChar);
            }
        }
    }

    return out.str();
}